

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_ptr<char,fmt::v10::appender,unsigned_long>
                   (appender out,unsigned_long value,format_specs<char> *specs)

{
  bool bVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar2;
  size_t sVar3;
  size_t size;
  unsigned_long uVar4;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_10;
  
  size = 2;
  uVar4 = value;
  do {
    sVar3 = size;
    size = sVar3 + 1;
    bVar1 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar1);
  local_10.num_digits = (int)sVar3 + -1;
  local_10.value = value;
  if (specs == (format_specs<char> *)0x0) {
    bVar2.container =
         (buffer<char> *)
         write_ptr<char,_fmt::v10::appender,_unsigned_long>::anon_class_16_2_92d121e5::operator()
                   (&local_10,
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  }
  else {
    bVar2.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_ptr<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,unsigned_long,fmt::v10::format_specs<char>const*)::_lambda(fmt::v10::appender)_1_&>
                   (out,specs,size,size,&local_10);
  }
  return (appender)bVar2.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs<Char>* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}